

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

char * toInternetFormat(char *name)

{
  char cVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *__ptr;
  void *pvVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  in_addr_t iVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *extraout_RAX;
  DNSRr *pDVar14;
  DNSRr *pDVar15;
  char *pcVar16;
  size_t sVar17;
  void *pvVar18;
  DNSQuery *__src;
  void *pvVar19;
  ushort uVar20;
  long lVar21;
  ulong unaff_RBX;
  int iVar22;
  DNSRr *unaff_RBP;
  in_addr_t *__dest;
  DNSRr *in_RSI;
  DNSRr *pDVar23;
  DNSRr *pDVar24;
  long *plVar25;
  char *pcVar26;
  ushort *puVar27;
  DNSRr *unaff_R12;
  ulong uVar28;
  DNSRr *unaff_R14;
  char *pcVar29;
  DNSRr *pDVar30;
  ushort *dnsQuery;
  int iStack_1e4;
  ushort uStack_1e0;
  ushort uStack_1de;
  ushort uStack_1dc;
  ushort uStack_1da;
  void *pvStack_1d8;
  void *pvStack_1d0;
  uint uStack_1c4;
  DNSRr *pDStack_1c0;
  char *pcStack_1b8;
  char *pcStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  code *pcStack_198;
  DNSRr *pDStack_188;
  char *pcStack_180;
  DNSRr *pDStack_178;
  char *pcStack_170;
  char *pcStack_168;
  code *pcStack_160;
  char *pcStack_150;
  char *pcStack_148;
  DNSRr *pDStack_140;
  size_t sStack_138;
  char *pcStack_130;
  code *pcStack_128;
  char *pcStack_118;
  DNSRr *pDStack_110;
  DNSRr *pDStack_108;
  char *pcStack_100;
  DNSRr *pDStack_f8;
  char *pcStack_f0;
  DNSRr *pDStack_e8;
  code *pcStack_e0;
  long *plStack_d0;
  DNSRr *pDStack_c8;
  DNSRr *pDStack_c0;
  DNSRr *pDStack_b8;
  DNSRr *pDStack_b0;
  code *pcStack_a8;
  undefined1 auStack_9c [44];
  undefined8 *puStack_70;
  char *pcStack_68;
  ushort auStack_30 [2];
  ushort uStack_2c;
  ushort uStack_2a;
  undefined4 uVar31;
  
  sVar10 = strlen(name);
  pcVar11 = (char *)malloc(sVar10 + 2);
  pcVar29 = (char *)(sVar10 + 1);
  pcVar12 = (char *)malloc((size_t)pcVar29);
  if (pcVar11 == (char *)0x0) {
    toInternetFormat_cold_2();
  }
  else if (pcVar12 != (char *)0x0) {
    strcpy(pcVar12,name);
    sVar10 = strlen(pcVar12);
    if (pcVar12[sVar10 - 1] != '.') {
      sVar10 = strlen(pcVar12);
      (pcVar12 + sVar10)[0] = '.';
      (pcVar12 + sVar10)[1] = '\0';
    }
    pcVar29 = pcVar11;
    if (*pcVar12 != '\0') {
      uVar28 = 0;
      iVar22 = 0;
      do {
        if (pcVar12[uVar28] == '.') {
          *pcVar29 = (char)uVar28 - (char)iVar22;
          pcVar29 = pcVar29 + 1;
          uVar13 = (ulong)iVar22;
          if ((long)uVar13 < (long)uVar28) {
            do {
              *pcVar29 = pcVar12[uVar13];
              uVar13 = uVar13 + 1;
              pcVar29 = pcVar29 + 1;
            } while (uVar28 != uVar13);
            iVar22 = (int)uVar13;
          }
          iVar22 = iVar22 + 1;
        }
        uVar28 = uVar28 + 1;
        sVar10 = strlen(pcVar12);
      } while (uVar28 < sVar10);
    }
    *pcVar29 = '\0';
    free(pcVar12);
    return pcVar11;
  }
  toInternetFormat_cold_1();
  if (pcVar29 != (char *)0x0) {
    return extraout_RAX;
  }
  checkMalloc_cold_1();
  plVar25 = (long *)&DAT_00000100;
  pcVar11 = (char *)malloc(0x100);
  if (pcVar11 != (char *)0x0) {
    cVar1 = *pcVar29;
    pcVar12 = pcVar11;
    while (cVar1 != '\0') {
      pcVar29 = pcVar29 + 1;
      if ('\0' < cVar1) {
        iVar22 = (int)cVar1;
        do {
          *pcVar12 = *pcVar29;
          pcVar12 = pcVar12 + 1;
          pcVar29 = pcVar29 + 1;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      *pcVar12 = '.';
      pcVar12 = pcVar12 + 1;
      cVar1 = *pcVar29;
    }
    pcVar12[-1] = '\0';
    return pcVar11;
  }
  toLocalFormat_cold_1();
  *plVar25 = 0xc;
  uVar28 = (ulong)extraout_RAX >> 0x20 & 0xffff;
  auStack_9c._12_8_ = (ulong)extraout_RAX >> 0x30;
  auStack_9c._4_8_ = unaff_RBX >> 0x10 & 0xffff;
  puStack_70 = (undefined8 *)0x0;
  auStack_9c._20_8_ = uVar28;
  pcStack_68 = pcVar29;
  if (uVar28 == 0) {
    pDVar14 = (DNSRr *)(auStack_9c + 0x1c);
    pDVar24 = unaff_R12;
  }
  else {
    pDVar24 = (DNSRr *)auStack_9c;
    pDVar15 = (DNSRr *)(auStack_9c + 0x1c);
    do {
      pcStack_a8 = (code *)0x101d1f;
      pDVar14 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar15->name + 0x10) = pDVar14;
      pcStack_a8 = (code *)0x101d31;
      in_RSI = pDVar24;
      pcVar29 = serilizeQuery((DNSQuery *)unaff_R12,(int *)pDVar24);
      *(char **)pDVar14->name = pcVar29;
      *(long *)(pDVar14->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar14->name[0x10] = '\0';
      pDVar14->name[0x11] = '\0';
      pDVar14->name[0x12] = '\0';
      pDVar14->name[0x13] = '\0';
      pDVar14->name[0x14] = '\0';
      pDVar14->name[0x15] = '\0';
      pDVar14->name[0x16] = '\0';
      pDVar14->name[0x17] = '\0';
      *plVar25 = *plVar25 + (long)(int)auStack_9c._0_4_;
      unaff_R12 = (DNSRr *)&unaff_R12->ttl;
      uVar28 = uVar28 - 1;
      pDVar15 = pDVar14;
    } while (uVar28 != 0);
  }
  pDVar15 = (DNSRr *)0x0;
  if (auStack_9c._12_8_ != 0) {
    pDVar15 = (DNSRr *)auStack_9c;
    uVar28 = auStack_9c._12_8_;
    pDVar30 = pDVar14;
    do {
      pcStack_a8 = (code *)0x101d80;
      pDVar14 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar30->name + 0x10) = pDVar14;
      pcStack_a8 = (code *)0x101d92;
      in_RSI = pDVar15;
      pcVar29 = serilizeRr(unaff_R14,(int *)pDVar15);
      *(char **)pDVar14->name = pcVar29;
      *(long *)(pDVar14->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar14->name[0x10] = '\0';
      pDVar14->name[0x11] = '\0';
      pDVar14->name[0x12] = '\0';
      pDVar14->name[0x13] = '\0';
      pDVar14->name[0x14] = '\0';
      pDVar14->name[0x15] = '\0';
      pDVar14->name[0x16] = '\0';
      pDVar14->name[0x17] = '\0';
      *plVar25 = *plVar25 + (long)(int)auStack_9c._0_4_;
      unaff_R14 = unaff_R14 + 1;
      uVar28 = uVar28 - 1;
      pDVar24 = unaff_R14;
      pDVar30 = pDVar14;
    } while (uVar28 != 0);
  }
  uVar28 = 0;
  pDVar30 = pDVar14;
  if (auStack_9c._4_8_ != 0) {
    pDVar24 = (DNSRr *)auStack_9c;
    uVar28 = auStack_9c._4_8_;
    do {
      pcStack_a8 = (code *)0x101de2;
      pDVar15 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar30->name + 0x10) = pDVar15;
      pcStack_a8 = (code *)0x101df4;
      in_RSI = pDVar24;
      pcVar29 = serilizeRr(unaff_RBP,(int *)pDVar24);
      *(char **)pDVar15->name = pcVar29;
      *(long *)(pDVar15->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar15->name[0x10] = '\0';
      pDVar15->name[0x11] = '\0';
      pDVar15->name[0x12] = '\0';
      pDVar15->name[0x13] = '\0';
      pDVar15->name[0x14] = '\0';
      pDVar15->name[0x15] = '\0';
      pDVar15->name[0x16] = '\0';
      pDVar15->name[0x17] = '\0';
      *plVar25 = *plVar25 + (long)(int)auStack_9c._0_4_;
      pDVar14 = unaff_RBP + 1;
      uVar28 = uVar28 - 1;
      unaff_RBP = pDVar14;
      pDVar30 = pDVar15;
    } while (uVar28 != 0);
  }
  pcVar11 = (char *)(*plVar25 + 10);
  pcStack_a8 = (code *)0x101e27;
  pcVar29 = (char *)malloc((size_t)pcVar11);
  if (pcVar29 != (char *)0x0) {
    auStack_30 = SUB84(extraout_RAX,0);
    uStack_2c = (ushort)auStack_9c._20_8_ << 8 | (ushort)auStack_9c._20_8_ >> 8;
    uStack_2a = (ushort)auStack_9c._12_8_ << 8 | (ushort)auStack_9c._12_8_ >> 8;
    uVar5 = _auStack_30;
    uVar31._0_2_ = (undefined2)unaff_RBX;
    uVar31._2_2_ = (ushort)auStack_9c._4_8_ << 8 | (ushort)auStack_9c._4_8_ >> 8;
    auStack_30[0] = (ushort)extraout_RAX;
    stack0xffffffffffffffd2 = SUB86(uVar5,2);
    auStack_30[0] = auStack_30[0] << 8 | auStack_30[0] >> 8;
    *(undefined4 *)(pcVar29 + 8) = uVar31;
    *(undefined8 *)pcVar29 = _auStack_30;
    pcVar11 = pcVar29 + 0xc;
    __ptr = puStack_70;
    while (__ptr != (undefined8 *)0x0) {
      pcStack_a8 = (code *)0x101e8f;
      memcpy(pcVar11,(void *)*__ptr,__ptr[1]);
      pcVar11 = pcVar11 + __ptr[1];
      pcStack_a8 = (code *)0x101e9d;
      free((void *)*__ptr);
      puVar3 = (undefined8 *)__ptr[2];
      pcStack_a8 = (code *)0x101eaa;
      free(__ptr);
      __ptr = puVar3;
    }
    *plVar25 = (long)pcVar11 - (long)pcVar29;
    return pcVar29;
  }
  pcStack_a8 = serilizeQuery;
  serilizeDNS_cold_1();
  pcStack_e0 = (code *)0x101ee5;
  pDVar23 = in_RSI;
  plStack_d0 = plVar25;
  pDStack_c8 = pDVar24;
  pDStack_c0 = pDVar15;
  pDStack_b8 = pDVar14;
  pDStack_b0 = pDVar30;
  pcStack_a8 = (code *)uVar28;
  pcVar12 = toInternetFormat(pcVar11);
  pcStack_e0 = (code *)0x101ef0;
  sVar10 = strlen(pcVar12);
  pcVar29 = (char *)(sVar10 + 6);
  pcStack_e0 = (code *)0x101ef9;
  pcVar16 = (char *)malloc((size_t)pcVar29);
  if (pcVar16 != (char *)0x0) {
    pcStack_e0 = (code *)0x101f0c;
    strcpy(pcVar16,pcVar12);
    pcStack_e0 = (code *)0x101f14;
    sVar10 = strlen(pcVar12);
    pcStack_e0 = (code *)0x101f25;
    free(pcVar12);
    *(ushort *)(pcVar16 + sVar10 + 1) =
         *(ushort *)(pcVar11 + 0x100) << 8 | *(ushort *)(pcVar11 + 0x100) >> 8;
    *(ushort *)(pcVar16 + sVar10 + 3) =
         *(ushort *)(pcVar11 + 0x102) << 8 | *(ushort *)(pcVar11 + 0x102) >> 8;
    *(int *)in_RSI->name = (int)sVar10 + 5;
    return pcVar16;
  }
  pcStack_e0 = serilizeRr;
  serilizeQuery_cold_1();
  pcStack_128 = (code *)0x101f83;
  pDStack_110 = pDVar23;
  pDStack_108 = in_RSI;
  pcStack_100 = pcVar12;
  pDStack_f8 = pDVar15;
  pcStack_f0 = pcVar11;
  pDStack_e8 = pDVar30;
  pcStack_e0 = (code *)uVar28;
  pcVar11 = toInternetFormat(pcVar29);
  if (*(short *)(pcVar29 + 0x100) == 1) {
    sVar10 = 4;
  }
  else {
    pcStack_128 = (code *)0x101fa5;
    pcStack_118 = toInternetFormat(pcVar29 + 0x10a);
    pcStack_128 = (code *)0x101fb2;
    sVar10 = strlen(pcStack_118);
  }
  pcStack_128 = (code *)0x101fbd;
  sVar17 = strlen(pcVar11);
  iVar22 = (int)sVar10;
  pcVar26 = (char *)((long)iVar22 + sVar17 + 0xe);
  pcStack_128 = (code *)0x101fcd;
  pcVar16 = (char *)malloc((size_t)pcVar26);
  if (pcVar16 == (char *)0x0) {
    pcStack_128 = deserilizeQuery;
    serilizeRr_cold_1();
    pcStack_160 = (code *)0x1020ea;
    pDVar14 = pDVar23;
    pcStack_150 = pcVar11;
    pcStack_148 = pcVar12;
    pDStack_140 = pDVar15;
    sStack_138 = sVar10;
    pcStack_130 = pcVar29;
    pcStack_128 = (code *)uVar28;
    pcVar11 = toLocalFormat(pcVar26);
    pcVar16 = (char *)0x104;
    pcStack_160 = (code *)0x1020f7;
    pcVar12 = (char *)malloc(0x104);
    if (pcVar12 != (char *)0x0) {
      pcStack_160 = (code *)0x10210a;
      strcpy(pcVar12,pcVar11);
      pcStack_160 = (code *)0x102112;
      sVar10 = strlen(pcVar26);
      pcStack_160 = (code *)0x102121;
      free(pcVar11);
      *(ushort *)(pcVar12 + 0x100) =
           *(ushort *)(pcVar26 + sVar10 + 1) << 8 | *(ushort *)(pcVar26 + sVar10 + 1) >> 8;
      *(ushort *)(pcVar12 + 0x102) =
           *(ushort *)(pcVar26 + sVar10 + 3) << 8 | *(ushort *)(pcVar26 + sVar10 + 3) >> 8;
      *(int *)pDVar23->name = (int)sVar10 + 5;
      return pcVar12;
    }
    pcStack_160 = deserilizeRr;
    deserilizeQuery_cold_1();
    pcStack_198 = (code *)0x10217a;
    pDVar24 = pDVar14;
    pDStack_188 = pDVar23;
    pcStack_180 = pcVar11;
    pDStack_178 = pDVar15;
    pcStack_170 = pcVar26;
    pcStack_168 = pcVar29;
    pcStack_160 = (code *)uVar28;
    pcVar12 = toLocalFormat(pcVar16);
    puVar27 = (ushort *)&DAT_0000020e;
    pcStack_198 = (code *)0x102187;
    pcVar26 = (char *)malloc(0x20e);
    if (pcVar26 == (char *)0x0) {
      pcStack_198 = deserializeDNS;
      deserilizeRr_cold_1();
      if (((DNSRr *)0xb < pDVar24) && (uStack_1c4 = (uint)puVar27[1], (puVar27[1] & 0x7078) == 0)) {
        uStack_1da = puVar27[4];
        dnsQuery = puVar27 + 6;
        pvStack_1d0 = (void *)CONCAT62(pvStack_1d0._2_6_,puVar27[5]);
        uVar6 = puVar27[3];
        uVar2 = *puVar27;
        uVar7 = puVar27[2];
        uVar20 = uVar7 << 8 | uVar7 >> 8;
        uStack_1dc = uVar20;
        pDStack_1c0 = pDVar14;
        pcStack_1b8 = pcVar11;
        pcStack_1b0 = pcVar12;
        pcStack_1a8 = pcVar16;
        pcStack_1a0 = pcVar29;
        pcStack_198 = (code *)uVar28;
        if (uVar7 == 0) {
          pvVar18 = (void *)0x0;
        }
        else {
          pvStack_1d8 = (void *)CONCAT62(pvStack_1d8._2_6_,uVar6);
          pvVar18 = malloc((ulong)uVar20 * 0x100 + (ulong)uVar20 * 4);
          uVar9 = 1;
          if (1 < uVar20) {
            uVar9 = (uint)uVar20;
          }
          lVar21 = 0;
          do {
            __src = deserilizeQuery((char *)dnsQuery,&iStack_1e4);
            memcpy((void *)((long)pvVar18 + lVar21),__src,0x104);
            dnsQuery = (ushort *)((long)iStack_1e4 + (long)dnsQuery);
            free(__src);
            lVar21 = lVar21 + 0x104;
          } while ((ulong)(uVar9 << 8) + (ulong)uVar9 * 4 != lVar21);
          uVar6 = (ushort)pvStack_1d8;
        }
        uVar7 = uVar6 << 8 | uVar6 >> 8;
        uStack_1de = uVar7;
        pvStack_1d8 = pvVar18;
        if (uVar6 == 0) {
          pvVar18 = (void *)0x0;
        }
        else {
          pvVar18 = malloc((ulong)uVar7 * 0x20c);
          uVar6 = 1;
          if (1 < uVar7) {
            uVar6 = uVar7;
          }
          lVar21 = 0;
          do {
            pDVar14 = deserilizeRr((char *)dnsQuery,&iStack_1e4);
            memcpy((void *)((long)pvVar18 + lVar21),pDVar14,0x20c);
            dnsQuery = (ushort *)((long)iStack_1e4 + (long)dnsQuery);
            free(pDVar14);
            lVar21 = lVar21 + 0x20c;
          } while ((ulong)uVar6 * 0x20c - lVar21 != 0);
        }
        uVar6 = (ushort)pvStack_1d0 << 8 | (ushort)pvStack_1d0 >> 8;
        if ((ushort)pvStack_1d0 == 0) {
          pvVar19 = (void *)0x0;
        }
        else {
          uStack_1e0 = uVar6;
          pvStack_1d0 = pvVar18;
          pvVar19 = malloc((ulong)uVar6 * 0x20c);
          uVar7 = 1;
          if (1 < uVar6) {
            uVar7 = uVar6;
          }
          lVar21 = 0;
          do {
            pDVar14 = deserilizeRr((char *)dnsQuery,&iStack_1e4);
            memcpy((void *)((long)pvVar19 + lVar21),pDVar14,0x20c);
            dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_1e4);
            free(pDVar14);
            lVar21 = lVar21 + 0x20c;
            pvVar18 = pvStack_1d0;
            uVar6 = uStack_1e0;
          } while ((ulong)uVar7 * 0x20c - lVar21 != 0);
        }
        pvVar4 = pvStack_1d8;
        puVar27 = (ushort *)malloc(0x30);
        *puVar27 = uVar2 << 8 | uVar2 >> 8;
        puVar27[1] = (ushort)uStack_1c4;
        puVar27[2] = uStack_1dc;
        puVar27[3] = uStack_1de;
        puVar27[4] = uStack_1da;
        puVar27[5] = uVar6;
        puVar27[6] = 0;
        puVar27[7] = 0;
        *(void **)(puVar27 + 8) = pvVar4;
        *(void **)(puVar27 + 0xc) = pvVar18;
        puVar27[0x10] = 0;
        puVar27[0x11] = 0;
        puVar27[0x12] = 0;
        puVar27[0x13] = 0;
        *(void **)(puVar27 + 0x14) = pvVar19;
        return (char *)puVar27;
      }
      return (char *)0x0;
    }
    pcStack_198 = (code *)0x10219e;
    strcpy(pcVar26,pcVar12);
    pcStack_198 = (code *)0x1021a6;
    sVar10 = strlen(pcVar16);
    pcVar29 = pcVar16 + sVar10;
    pcStack_198 = (code *)0x1021b5;
    free(pcVar12);
    uVar6 = *(ushort *)(pcVar16 + sVar10 + 1) << 8 | *(ushort *)(pcVar16 + sVar10 + 1) >> 8;
    *(ushort *)(pcVar26 + 0x100) = uVar6;
    *(ushort *)(pcVar26 + 0x102) =
         *(ushort *)(pcVar16 + sVar10 + 3) << 8 | *(ushort *)(pcVar16 + sVar10 + 3) >> 8;
    uVar9 = *(uint *)(pcVar16 + sVar10 + 5);
    *(uint *)(pcVar26 + 0x104) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    *(ushort *)(pcVar26 + 0x108) =
         *(ushort *)(pcVar16 + sVar10 + 9) << 8 | *(ushort *)(pcVar16 + sVar10 + 9) >> 8;
    if (uVar6 == 0xf) {
      pcStack_198 = (code *)0x102240;
      pcVar11 = toLocalFormat(pcVar29 + 0xd);
      pcStack_198 = (code *)0x10224b;
      strcpy(pcVar26 + 0x10a,pcVar11);
      pcStack_198 = (code *)0x102253;
      sVar10 = strlen(pcVar29 + 0xd);
      iVar22 = (int)pcVar29 + (int)sVar10 + 0xe;
    }
    else if (uVar6 == 1) {
      pcStack_198 = (code *)0x102219;
      pcVar11 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar29 + 0xb));
      pcStack_198 = (code *)0x102224;
      strcpy(pcVar26 + 0x10a,pcVar11);
      iVar22 = (int)pcVar29 + 0xf;
    }
    else {
      pcVar11 = pcVar16 + sVar10 + 0xb;
      pcStack_198 = (code *)0x102275;
      pcVar29 = toLocalFormat(pcVar11);
      pcStack_198 = (code *)0x102280;
      strcpy(pcVar26 + 0x10a,pcVar29);
      pcStack_198 = (code *)0x102288;
      sVar10 = strlen(pcVar11);
      iVar22 = (int)pcVar11 + (int)sVar10 + 1;
    }
    *(int *)pDVar14->name = iVar22 - (int)pcVar16;
    return pcVar26;
  }
  pcStack_128 = (code *)0x101fe4;
  strcpy(pcVar16,pcVar11);
  pcStack_128 = (code *)0x101fec;
  sVar17 = strlen(pcVar11);
  pcStack_128 = (code *)0x101ffd;
  free(pcVar11);
  pcVar11 = pcStack_118;
  uVar6 = *(ushort *)(pcVar29 + 0x100);
  *(ushort *)(pcVar16 + sVar17 + 1) = uVar6 << 8 | uVar6 >> 8;
  *(ushort *)(pcVar16 + sVar17 + 3) =
       *(ushort *)(pcVar29 + 0x102) << 8 | *(ushort *)(pcVar29 + 0x102) >> 8;
  uVar9 = *(uint *)(pcVar29 + 0x104);
  *(uint *)(pcVar16 + sVar17 + 5) =
       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar2 = (ushort)sVar10;
  if (uVar6 == 1) {
    *(ushort *)(pcVar16 + sVar17 + 9) = uVar2 << 8 | uVar2 >> 8;
  }
  else {
    if (uVar6 == 0xf) {
      *(ushort *)(pcVar16 + sVar17 + 9) = (uVar2 + 3) * 0x100 | (ushort)(uVar2 + 3) >> 8;
      (pcVar16 + sVar17 + 0xb)[0] = '\0';
      (pcVar16 + sVar17 + 0xb)[1] = '\x05';
      lVar21 = 0xd;
      goto LAB_00102072;
    }
    *(ushort *)(pcVar16 + sVar17 + 9) = (uVar2 + 1) * 0x100 | (ushort)(uVar2 + 1) >> 8;
  }
  lVar21 = 0xb;
LAB_00102072:
  __dest = (in_addr_t *)(pcVar16 + lVar21 + sVar17);
  if (uVar6 == 1) {
    pcStack_128 = (code *)0x10208a;
    iVar8 = inet_addr(pcVar29 + 0x10a);
    *__dest = iVar8;
  }
  else {
    pcStack_128 = (code *)0x1020a6;
    memcpy(__dest,pcStack_118,(long)(iVar22 + 1));
    pcStack_128 = (code *)0x1020ae;
    free(pcVar11);
  }
  *(int *)pDStack_110->name = (((int)__dest + iVar22) - (int)pcVar16) + 1;
  return pcVar16;
}

Assistant:

char *toInternetFormat(char *name)
{
    char *result = (char *) malloc(strlen(name) + 2);
    char *domain = (char *) malloc(strlen(name) + 1);
    checkMalloc(result);
    checkMalloc(domain);

    strcpy(domain, name);
    char *dns = result;
    int lock = 0;

    // 尾部补 “.”
    if (domain[strlen((char *) domain) - 1] != '.')
        strcat((char *) domain, ".");

    for (int i = 0; i < strlen((char *) domain); i++)
    {
        if (domain[i] == '.')
        {
            *dns++ = i - lock;
            for (; lock < i; lock++)
            {
                *dns++ = domain[lock];
            }
            lock++;
        }
    }
    *dns++ = '\0';

    free(domain);

    return result;
}